

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderQualifiers.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderFlatInterpolationTest::GeometryShaderFlatInterpolationTest
          (GeometryShaderFlatInterpolationTest *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseBase_0214cc98;
  this->m_bo_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

GeometryShaderFlatInterpolationTest::GeometryShaderFlatInterpolationTest(Context&			  context,
																		 const ExtParameters& extParams,
																		 const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_bo_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
{
	/* Nothing to be done here */
}